

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathNodeCollectAndTest
              (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first,xmlNodePtr *last
              ,int toBool)

{
  double dVar1;
  int iVar2;
  xmlElementType xVar3;
  xmlElementType xVar4;
  xmlChar *prefix;
  xmlChar *str2;
  xmlXPathContextPtr ctxt_00;
  xmlXPathObjectPtr *ppxVar5;
  xmlNodeSetPtr pxVar6;
  xmlXPathStepOp *pxVar7;
  int *piVar8;
  xmlNodePtr pxVar9;
  xmlNodePtr pxVar10;
  void *pvVar11;
  xmlXPathObjectPtr pxVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  xmlChar *pxVar18;
  xmlNodeSetPtr set;
  xmlNodePtr node2;
  xmlNs *pxVar19;
  xmlXPathObjectPtr pxVar20;
  long lVar21;
  code *pcVar22;
  xmlXPathStepOpPtr op_00;
  xmlAttrPtr attr;
  int iVar23;
  xmlChar *str2_00;
  xmlChar *str1;
  xmlNodeSetPtr pxVar24;
  int iVar25;
  bool bVar26;
  int local_d4;
  int local_b4;
  code *local_a8;
  xmlNodeSetPtr local_a0;
  xmlNodePtr *local_90;
  
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NODESET)) {
    iVar23 = 0xb;
LAB_001c4ed0:
    xmlXPathErr(ctxt,iVar23);
    return 0;
  }
  iVar23 = op->value;
  iVar2 = op->value2;
  xVar3 = op->value3;
  prefix = (xmlChar *)op->value4;
  str2 = (xmlChar *)op->value5;
  ctxt_00 = ctxt->context;
  iVar25 = ctxt->valueNr;
  if ((long)iVar25 < 1) {
    pxVar20 = (xmlXPathObjectPtr)0x0;
  }
  else {
    uVar15 = iVar25 - 1;
    ctxt->valueNr = uVar15;
    ppxVar5 = ctxt->valueTab;
    if (iVar25 == 1) {
      pxVar20 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar20 = ppxVar5[(long)iVar25 + -2];
    }
    ctxt->value = pxVar20;
    pxVar20 = ppxVar5[uVar15];
    ppxVar5[uVar15] = (xmlXPathObjectPtr)0x0;
  }
  if (prefix == (xmlChar *)0x0) {
    pxVar18 = (xmlChar *)0x0;
  }
  else {
    pxVar18 = xmlXPathNsLookup(ctxt_00,prefix);
    if (pxVar18 == (xmlChar *)0x0) {
      xmlXPathReleaseObject(ctxt_00,pxVar20);
      iVar23 = 0x13;
      goto LAB_001c4ed0;
    }
  }
  pcVar22 = xmlXPathNodeSetMergeAndClear;
  local_90 = last;
  switch(iVar23) {
  case 1:
    local_a8 = xmlXPathNextAncestor;
    break;
  case 2:
    local_a8 = xmlXPathNextAncestorOrSelf;
    break;
  case 3:
    local_a8 = xmlXPathNextAttribute;
    goto LAB_001c5037;
  case 4:
    if ((iVar2 - 3U & 0xfffffffd) == 0 && xVar3 == 0) {
      local_a8 = xmlXPathNextChildElement;
    }
    else {
      local_a8 = xmlXPathNextChild;
    }
    pcVar22 = xmlXPathNodeSetMergeAndClearNoDupls;
    goto LAB_001c5010;
  case 5:
    local_a8 = xmlXPathNextDescendant;
    goto LAB_001c5010;
  case 6:
    local_a8 = xmlXPathNextDescendantOrSelf;
    goto LAB_001c5010;
  case 7:
    local_a8 = xmlXPathNextFollowing;
    goto LAB_001c5010;
  case 8:
    local_a8 = xmlXPathNextFollowingSibling;
LAB_001c5010:
    local_90 = (xmlNodePtr *)0x0;
    goto LAB_001c5048;
  case 9:
    local_a8 = xmlXPathNextNamespace;
    goto LAB_001c5037;
  case 10:
    local_a8 = xmlXPathNextParent;
    break;
  case 0xb:
    local_a8 = xmlXPathNextPrecedingInternal;
    break;
  case 0xc:
    local_a8 = xmlXPathNextPrecedingSibling;
    break;
  case 0xd:
    local_a8 = xmlXPathNextSelf;
LAB_001c5037:
    pcVar22 = xmlXPathNodeSetMergeAndClearNoDupls;
    local_90 = (xmlNodePtr *)0x0;
    break;
  default:
    xmlXPathReleaseObject(ctxt_00,pxVar20);
    return 0;
  }
  first = (xmlNodePtr *)0x0;
LAB_001c5048:
  pxVar6 = pxVar20->nodesetval;
  if ((pxVar6 == (xmlNodeSetPtr)0x0) || (pxVar6->nodeNr < 1)) {
    xmlXPathValuePush(ctxt,pxVar20);
    return 0;
  }
  lVar21 = (long)op->ch2;
  iVar25 = 0;
  bVar14 = true;
  if (lVar21 == -1) {
    local_d4 = 0;
    op_00 = (xmlXPathStepOpPtr)0x0;
  }
  else {
    pxVar7 = ctxt->comp->steps;
    op_00 = pxVar7 + lVar21;
    if (((((1 < pxVar7[lVar21].op - XPATH_OP_PREDICATE) || (lVar21 = (long)op_00->ch2, lVar21 == -1)
          ) || (pxVar7[lVar21].op != XPATH_OP_VALUE)) ||
        ((piVar8 = (int *)pxVar7[lVar21].value4, piVar8 == (int *)0x0 || (*piVar8 != 3)))) ||
       ((dVar1 = *(double *)(piVar8 + 6), dVar1 <= -2147483648.0 || (2147483647.0 <= dVar1)))) {
      local_d4 = 0;
    }
    else {
      local_d4 = (int)dVar1;
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
        if ((long)op_00->ch1 == -1) {
          op_00 = (xmlXPathStepOpPtr)0x0;
          bVar13 = true;
          bVar14 = false;
        }
        else {
          op_00 = pxVar7 + op_00->ch1;
          bVar13 = false;
        }
        goto LAB_001c5148;
      }
    }
  }
  bVar13 = true;
LAB_001c5148:
  pxVar9 = ctxt_00->node;
  lVar21 = 0;
  set = (xmlNodeSetPtr)0x0;
  local_a0 = (xmlNodeSetPtr)0x0;
LAB_001c5188:
  pxVar24 = set;
  if (ctxt->error == 0) {
    ctxt_00->node = pxVar6->nodeTab[lVar21];
    if (set == (xmlNodeSetPtr)0x0) {
      set = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
      if (set == (xmlNodeSetPtr)0x0) {
        xmlXPathPErrMemory(ctxt);
        pxVar24 = (xmlNodeSetPtr)0x0;
        iVar25 = 0;
        goto LAB_001c56f0;
      }
      set->nodeNr = 0;
      set->nodeMax = 0;
      set->nodeTab = (xmlNodePtr *)0x0;
    }
    lVar21 = lVar21 + 1;
    node2 = (xmlNodePtr)0x0;
    iVar17 = 0;
    local_b4 = 0;
LAB_001c51e8:
    pxVar24 = set;
    if ((ctxt->context->opLimit != 0) && (iVar16 = xmlXPathCheckOpLimit(ctxt,1), iVar16 < 0))
    goto LAB_001c56f0;
    node2 = (xmlNodePtr)(*local_a8)(ctxt,node2);
    if (((node2 == (xmlNodePtr)0x0) ||
        (((first != (xmlNodePtr *)0x0 && (pxVar10 = *first, pxVar10 != (xmlNodePtr)0x0)) &&
         ((pxVar10 == node2 ||
          (((char)iVar25 == '\0' && (iVar16 = xmlXPathCmpNodesExt(pxVar10,node2), -1 < iVar16)))))))
        ) || ((local_90 != (xmlNodePtr *)0x0 &&
              ((pxVar10 = *local_90, pxVar10 != (xmlNodePtr)0x0 &&
               ((pxVar10 == node2 ||
                (((char)iVar25 == '\0' && (iVar16 = xmlXPathCmpNodesExt(node2,pxVar10), -1 < iVar16)
                 ))))))))) {
      if (ctxt->error != 0) goto LAB_001c56f0;
      if (op_00 != (xmlXPathStepOpPtr)0x0) {
        if (set->nodeNr < 1) goto LAB_001c5623;
        iVar17 = local_d4;
        iVar16 = local_d4;
        if (bVar13) {
          iVar17 = set->nodeNr;
          iVar16 = 1;
        }
        xmlXPathCompOpEvalPredicate(ctxt,op_00,set,iVar16,iVar17,local_b4);
        if (ctxt->error != 0) {
          iVar25 = 0;
          goto LAB_001c56f0;
        }
      }
      if (set->nodeNr < 1) goto LAB_001c5623;
      if (local_a0 == (xmlNodeSetPtr)0x0) {
        pxVar24 = (xmlNodeSetPtr)0x0;
        local_a0 = set;
      }
      else {
        local_a0 = (xmlNodeSetPtr)(*pcVar22)(local_a0,set);
        if (local_a0 == (xmlNodeSetPtr)0x0) {
          xmlXPathPErrMemory(ctxt);
          local_a0 = (xmlNodeSetPtr)0x0;
        }
      }
      goto joined_r0x001c561d;
    }
    iVar25 = iVar25 + 1;
    switch(iVar2) {
    case 0:
      iVar25 = iVar2;
      goto LAB_001c56f0;
    case 1:
      xVar4 = node2->type;
      if (xVar3 == 0) {
        if (XML_NAMESPACE_DECL < xVar4) break;
        if ((0x239eU >> (xVar4 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)
        goto joined_r0x001c54e5;
        if (xVar4 != XML_NAMESPACE_DECL) goto LAB_001c5512;
        if (iVar23 == 9) goto LAB_001c541c;
        if (bVar14) {
          iVar16 = xmlXPathNodeSetAddUnique(set,node2);
          goto LAB_001c543d;
        }
        local_b4 = 1;
      }
      else {
        if (xVar4 == xVar3) {
          if (xVar3 == XML_NAMESPACE_DECL) goto LAB_001c53f3;
        }
        else {
          if (xVar3 != XML_TEXT_NODE) break;
          bVar26 = xVar4 == XML_CDATA_SECTION_NODE;
LAB_001c54db:
          if (!bVar26) goto LAB_001c5512;
        }
joined_r0x001c54e5:
        if (bVar14) {
          iVar16 = xmlXPathNodeSetAddUnique(set,node2);
          if (iVar16 < 0) {
            xmlXPathPErrMemory(ctxt);
          }
LAB_001c5500:
          if (op_00 != (xmlXPathStepOpPtr)0x0 || toBool == 0) goto LAB_001c5512;
          if (local_a0 == (xmlNodeSetPtr)0x0) {
            pxVar24 = (xmlNodeSetPtr)0x0;
            local_a0 = set;
          }
          else {
            local_a0 = (xmlNodeSetPtr)(*pcVar22)(local_a0,set);
            if (local_a0 == (xmlNodeSetPtr)0x0) {
              xmlXPathPErrMemory(ctxt);
              local_a0 = (xmlNodeSetPtr)0x0;
            }
          }
          goto LAB_001c56f0;
        }
      }
      iVar17 = iVar17 + 1;
      if (iVar17 != local_d4) goto LAB_001c5512;
      iVar17 = xmlXPathNodeSetAddUnique(set,node2);
LAB_001c5667:
      if (iVar17 < 0) {
        xmlXPathPErrMemory(ctxt);
      }
      if (local_a0 == (xmlNodeSetPtr)0x0) {
        pxVar24 = (xmlNodeSetPtr)0x0;
        local_a0 = set;
      }
      else {
        local_a0 = (xmlNodeSetPtr)(*pcVar22)(local_a0,set);
        if (local_a0 == (xmlNodeSetPtr)0x0) {
          xmlXPathPErrMemory(ctxt);
          local_a0 = (xmlNodeSetPtr)0x0;
        }
      }
joined_r0x001c561d:
      set = pxVar24;
      pxVar24 = set;
      if (toBool == 0) goto LAB_001c5623;
      goto LAB_001c56f0;
    case 2:
      if (node2->type == XML_PI_NODE) {
        if (str2 == (xmlChar *)0x0) goto joined_r0x001c54e5;
        str2_00 = node2->name;
        str1 = str2;
LAB_001c54b1:
        iVar16 = xmlStrEqual(str1,str2_00);
        if (iVar16 != 0) goto joined_r0x001c54e5;
      }
      break;
    case 3:
      xVar4 = node2->type;
      if (iVar23 == 9) {
        if (xVar4 == XML_NAMESPACE_DECL) {
LAB_001c541c:
          if (bVar14) goto LAB_001c5427;
          iVar17 = iVar17 + 1;
          if (iVar17 == local_d4) goto LAB_001c564e;
        }
      }
      else {
        if (iVar23 == 3) {
          bVar26 = xVar4 == XML_ATTRIBUTE_NODE;
        }
        else {
          bVar26 = xVar4 == XML_ELEMENT_NODE;
        }
        if (bVar26) {
          if (prefix == (xmlChar *)0x0) goto joined_r0x001c54e5;
          pxVar19 = node2->ns;
          if (pxVar19 == (xmlNs *)0x0) goto LAB_001c5512;
LAB_001c54a8:
          str2_00 = pxVar19->href;
          str1 = pxVar18;
          goto LAB_001c54b1;
        }
      }
      goto LAB_001c5512;
    case 5:
      xVar4 = node2->type;
      if (iVar23 == 9) {
        if (((xVar4 == XML_NAMESPACE_DECL) &&
            (node2->children != (_xmlNode *)0x0 && str2 != (xmlChar *)0x0)) &&
           (iVar16 = xmlStrEqual((xmlChar *)node2->children,str2), iVar16 != 0)) {
LAB_001c53f3:
          if (bVar14) {
LAB_001c5427:
            iVar16 = xmlXPathNodeSetAddNs(set,ctxt_00->node,(xmlNsPtr)node2);
LAB_001c543d:
            if (iVar16 < 0) {
              xmlXPathPErrMemory(ctxt);
            }
            local_b4 = 1;
            goto LAB_001c5500;
          }
          iVar17 = iVar17 + 1;
          if (iVar17 != local_d4) goto LAB_001c5512;
LAB_001c564e:
          iVar17 = xmlXPathNodeSetAddNs(set,ctxt_00->node,(xmlNsPtr)node2);
          goto LAB_001c5667;
        }
      }
      else if (iVar23 == 3) {
        if ((xVar4 == XML_ATTRIBUTE_NODE) && (iVar16 = xmlStrEqual(str2,node2->name), iVar16 != 0))
        {
          pxVar19 = node2->ns;
          if (prefix == (xmlChar *)0x0) {
            if ((pxVar19 == (xmlNs *)0x0) || (pxVar19->prefix == (xmlChar *)0x0))
            goto joined_r0x001c54e5;
            goto LAB_001c5512;
          }
LAB_001c5485:
          if (pxVar19 != (xmlNs *)0x0) goto LAB_001c54a8;
        }
      }
      else if ((xVar4 == XML_ELEMENT_NODE) && (iVar16 = xmlStrEqual(str2,node2->name), iVar16 != 0))
      {
        pxVar19 = node2->ns;
        if (prefix == (xmlChar *)0x0) {
          bVar26 = pxVar19 == (xmlNs *)0x0;
          goto LAB_001c54db;
        }
        goto LAB_001c5485;
      }
    }
LAB_001c5512:
    if (ctxt->error != 0) goto LAB_001c56f0;
    goto LAB_001c51e8;
  }
  goto LAB_001c56f0;
LAB_001c5623:
  pxVar24 = set;
  if (pxVar6->nodeNr <= lVar21) {
LAB_001c56f0:
    if ((pxVar20->boolval != 0) && (pvVar11 = pxVar20->user, pvVar11 != (void *)0x0)) {
      pxVar12 = ctxt->value;
      pxVar12->boolval = 1;
      pxVar12->user = pvVar11;
      pxVar20->user = (void *)0x0;
      pxVar20->boolval = 0;
    }
    xmlXPathReleaseObject(ctxt_00,pxVar20);
    if ((local_a0 == (xmlNodeSetPtr)0x0) &&
       ((pxVar24 == (xmlNodeSetPtr)0x0 || (local_a0 = pxVar24, pxVar24->nodeNr != 0)))) {
      local_a0 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
      if (local_a0 == (xmlNodeSetPtr)0x0) {
        xmlXPathPErrMemory(ctxt);
        local_a0 = (xmlNodeSetPtr)0x0;
      }
      else {
        local_a0->nodeNr = 0;
        local_a0->nodeMax = 0;
        local_a0->nodeTab = (xmlNodePtr *)0x0;
      }
    }
    if ((pxVar24 != (xmlNodeSetPtr)0x0) && (pxVar24 != local_a0)) {
      xmlXPathFreeNodeSet(pxVar24);
    }
    pxVar20 = xmlXPathCacheWrapNodeSet(ctxt,local_a0);
    xmlXPathValuePush(ctxt,pxVar20);
    ctxt_00->node = pxVar9;
    if (ctxt_00->tmpNsList != (xmlNsPtr *)0x0) {
      (*xmlFree)(ctxt_00->tmpNsList);
      ctxt_00->tmpNsList = (xmlNsPtr *)0x0;
    }
    return iVar25;
  }
  goto LAB_001c5188;
}

Assistant:

static int
xmlXPathNodeCollectAndTest(xmlXPathParserContextPtr ctxt,
                           xmlXPathStepOpPtr op,
			   xmlNodePtr * first, xmlNodePtr * last,
			   int toBool)
{

#define XP_TEST_HIT \
    if (hasAxisRange != 0) { \
	if (++pos == maxPos) { \
	    if (addNode(seq, cur) < 0) \
	        xmlXPathPErrMemory(ctxt); \
	    goto axis_range_end; } \
    } else { \
	if (addNode(seq, cur) < 0) \
	    xmlXPathPErrMemory(ctxt); \
	if (breakOnFirstHit) goto first_hit; }

#define XP_TEST_HIT_NS \
    if (hasAxisRange != 0) { \
	if (++pos == maxPos) { \
	    hasNsNodes = 1; \
	    if (xmlXPathNodeSetAddNs(seq, xpctxt->node, (xmlNsPtr) cur) < 0) \
	        xmlXPathPErrMemory(ctxt); \
	goto axis_range_end; } \
    } else { \
	hasNsNodes = 1; \
	if (xmlXPathNodeSetAddNs(seq, xpctxt->node, (xmlNsPtr) cur) < 0) \
	    xmlXPathPErrMemory(ctxt); \
	if (breakOnFirstHit) goto first_hit; }

    xmlXPathAxisVal axis = (xmlXPathAxisVal) op->value;
    xmlXPathTestVal test = (xmlXPathTestVal) op->value2;
    xmlXPathTypeVal type = (xmlXPathTypeVal) op->value3;
    const xmlChar *prefix = op->value4;
    const xmlChar *name = op->value5;
    const xmlChar *URI = NULL;

    int total = 0, hasNsNodes = 0;
    /* The popped object holding the context nodes */
    xmlXPathObjectPtr obj;
    /* The set of context nodes for the node tests */
    xmlNodeSetPtr contextSeq;
    int contextIdx;
    xmlNodePtr contextNode;
    /* The final resulting node set wrt to all context nodes */
    xmlNodeSetPtr outSeq;
    /*
    * The temporary resulting node set wrt 1 context node.
    * Used to feed predicate evaluation.
    */
    xmlNodeSetPtr seq;
    xmlNodePtr cur;
    /* First predicate operator */
    xmlXPathStepOpPtr predOp;
    int maxPos; /* The requested position() (when a "[n]" predicate) */
    int hasPredicateRange, hasAxisRange, pos;
    int breakOnFirstHit;

    xmlXPathTraversalFunction next = NULL;
    int (*addNode) (xmlNodeSetPtr, xmlNodePtr);
    xmlXPathNodeSetMergeFunction mergeAndClear;
    xmlNodePtr oldContextNode;
    xmlXPathContextPtr xpctxt = ctxt->context;


    CHECK_TYPE0(XPATH_NODESET);
    obj = xmlXPathValuePop(ctxt);
    /*
    * Setup namespaces.
    */
    if (prefix != NULL) {
        URI = xmlXPathNsLookup(xpctxt, prefix);
        if (URI == NULL) {
	    xmlXPathReleaseObject(xpctxt, obj);
            XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
	}
    }
    /*
    * Setup axis.
    *
    * MAYBE FUTURE TODO: merging optimizations:
    * - If the nodes to be traversed wrt to the initial nodes and
    *   the current axis cannot overlap, then we could avoid searching
    *   for duplicates during the merge.
    *   But the question is how/when to evaluate if they cannot overlap.
    *   Example: if we know that for two initial nodes, the one is
    *   not in the ancestor-or-self axis of the other, then we could safely
    *   avoid a duplicate-aware merge, if the axis to be traversed is e.g.
    *   the descendant-or-self axis.
    */
    mergeAndClear = xmlXPathNodeSetMergeAndClear;
    switch (axis) {
        case AXIS_ANCESTOR:
            first = NULL;
            next = xmlXPathNextAncestor;
            break;
        case AXIS_ANCESTOR_OR_SELF:
            first = NULL;
            next = xmlXPathNextAncestorOrSelf;
            break;
        case AXIS_ATTRIBUTE:
            first = NULL;
	    last = NULL;
            next = xmlXPathNextAttribute;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_CHILD:
	    last = NULL;
	    if (((test == NODE_TEST_NAME) || (test == NODE_TEST_ALL)) &&
		(type == NODE_TYPE_NODE))
	    {
		/*
		* Optimization if an element node type is 'element'.
		*/
		next = xmlXPathNextChildElement;
	    } else
		next = xmlXPathNextChild;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_DESCENDANT:
	    last = NULL;
            next = xmlXPathNextDescendant;
            break;
        case AXIS_DESCENDANT_OR_SELF:
	    last = NULL;
            next = xmlXPathNextDescendantOrSelf;
            break;
        case AXIS_FOLLOWING:
	    last = NULL;
            next = xmlXPathNextFollowing;
            break;
        case AXIS_FOLLOWING_SIBLING:
	    last = NULL;
            next = xmlXPathNextFollowingSibling;
            break;
        case AXIS_NAMESPACE:
            first = NULL;
	    last = NULL;
            next = (xmlXPathTraversalFunction) xmlXPathNextNamespace;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_PARENT:
            first = NULL;
            next = xmlXPathNextParent;
            break;
        case AXIS_PRECEDING:
            first = NULL;
            next = xmlXPathNextPrecedingInternal;
            break;
        case AXIS_PRECEDING_SIBLING:
            first = NULL;
            next = xmlXPathNextPrecedingSibling;
            break;
        case AXIS_SELF:
            first = NULL;
	    last = NULL;
            next = xmlXPathNextSelf;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
    }

    if (next == NULL) {
	xmlXPathReleaseObject(xpctxt, obj);
        return(0);
    }
    contextSeq = obj->nodesetval;
    if ((contextSeq == NULL) || (contextSeq->nodeNr <= 0)) {
        xmlXPathValuePush(ctxt, obj);
        return(0);
    }
    /*
    * Predicate optimization ---------------------------------------------
    * If this step has a last predicate, which contains a position(),
    * then we'll optimize (although not exactly "position()", but only
    * the  short-hand form, i.e., "[n]".
    *
    * Example - expression "/foo[parent::bar][1]":
    *
    * COLLECT 'child' 'name' 'node' foo    -- op (we are here)
    *   ROOT                               -- op->ch1
    *   PREDICATE                          -- op->ch2 (predOp)
    *     PREDICATE                          -- predOp->ch1 = [parent::bar]
    *       SORT
    *         COLLECT  'parent' 'name' 'node' bar
    *           NODE
    *     ELEM Object is a number : 1        -- predOp->ch2 = [1]
    *
    */
    maxPos = 0;
    predOp = NULL;
    hasPredicateRange = 0;
    hasAxisRange = 0;
    if (op->ch2 != -1) {
	/*
	* There's at least one predicate. 16 == XPATH_OP_PREDICATE
	*/
	predOp = &ctxt->comp->steps[op->ch2];
	if (xmlXPathIsPositionalPredicate(ctxt, predOp, &maxPos)) {
	    if (predOp->ch1 != -1) {
		/*
		* Use the next inner predicate operator.
		*/
		predOp = &ctxt->comp->steps[predOp->ch1];
		hasPredicateRange = 1;
	    } else {
		/*
		* There's no other predicate than the [n] predicate.
		*/
		predOp = NULL;
		hasAxisRange = 1;
	    }
	}
    }
    breakOnFirstHit = ((toBool) && (predOp == NULL)) ? 1 : 0;
    /*
    * Axis traversal -----------------------------------------------------
    */
    /*
     * 2.3 Node Tests
     *  - For the attribute axis, the principal node type is attribute.
     *  - For the namespace axis, the principal node type is namespace.
     *  - For other axes, the principal node type is element.
     *
     * A node test * is true for any node of the
     * principal node type. For example, child::* will
     * select all element children of the context node
     */
    oldContextNode = xpctxt->node;
    addNode = xmlXPathNodeSetAddUnique;
    outSeq = NULL;
    seq = NULL;
    contextNode = NULL;
    contextIdx = 0;


    while (((contextIdx < contextSeq->nodeNr) || (contextNode != NULL)) &&
           (ctxt->error == XPATH_EXPRESSION_OK)) {
	xpctxt->node = contextSeq->nodeTab[contextIdx++];

	if (seq == NULL) {
	    seq = xmlXPathNodeSetCreate(NULL);
	    if (seq == NULL) {
                xmlXPathPErrMemory(ctxt);
		total = 0;
		goto error;
	    }
	}
	/*
	* Traverse the axis and test the nodes.
	*/
	pos = 0;
	cur = NULL;
	hasNsNodes = 0;
        do {
            if (OP_LIMIT_EXCEEDED(ctxt, 1))
                goto error;

            cur = next(ctxt, cur);
            if (cur == NULL)
                break;

	    /*
	    * QUESTION TODO: What does the "first" and "last" stuff do?
	    */
            if ((first != NULL) && (*first != NULL)) {
		if (*first == cur)
		    break;
		if (((total % 256) == 0) &&
#ifdef XP_OPTIMIZED_NON_ELEM_COMPARISON
		    (xmlXPathCmpNodesExt(*first, cur) >= 0))
#else
		    (xmlXPathCmpNodes(*first, cur) >= 0))
#endif
		{
		    break;
		}
	    }
	    if ((last != NULL) && (*last != NULL)) {
		if (*last == cur)
		    break;
		if (((total % 256) == 0) &&
#ifdef XP_OPTIMIZED_NON_ELEM_COMPARISON
		    (xmlXPathCmpNodesExt(cur, *last) >= 0))
#else
		    (xmlXPathCmpNodes(cur, *last) >= 0))
#endif
		{
		    break;
		}
	    }

            total++;

	    switch (test) {
                case NODE_TEST_NONE:
		    total = 0;
		    goto error;
                case NODE_TEST_TYPE:
		    if (type == NODE_TYPE_NODE) {
			switch (cur->type) {
			    case XML_DOCUMENT_NODE:
			    case XML_HTML_DOCUMENT_NODE:
			    case XML_ELEMENT_NODE:
			    case XML_ATTRIBUTE_NODE:
			    case XML_PI_NODE:
			    case XML_COMMENT_NODE:
			    case XML_CDATA_SECTION_NODE:
			    case XML_TEXT_NODE:
				XP_TEST_HIT
				break;
			    case XML_NAMESPACE_DECL: {
				if (axis == AXIS_NAMESPACE) {
				    XP_TEST_HIT_NS
				} else {
	                            hasNsNodes = 1;
				    XP_TEST_HIT
				}
				break;
                            }
			    default:
				break;
			}
		    } else if (cur->type == (xmlElementType) type) {
			if (cur->type == XML_NAMESPACE_DECL)
			    XP_TEST_HIT_NS
			else
			    XP_TEST_HIT
		    } else if ((type == NODE_TYPE_TEXT) &&
			 (cur->type == XML_CDATA_SECTION_NODE))
		    {
			XP_TEST_HIT
		    }
		    break;
                case NODE_TEST_PI:
                    if ((cur->type == XML_PI_NODE) &&
                        ((name == NULL) || xmlStrEqual(name, cur->name)))
		    {
			XP_TEST_HIT
                    }
                    break;
                case NODE_TEST_ALL:
                    if (axis == AXIS_ATTRIBUTE) {
                        if (cur->type == XML_ATTRIBUTE_NODE)
			{
                            if (prefix == NULL)
			    {
				XP_TEST_HIT
                            } else if ((cur->ns != NULL) &&
				(xmlStrEqual(URI, cur->ns->href)))
			    {
				XP_TEST_HIT
                            }
                        }
                    } else if (axis == AXIS_NAMESPACE) {
                        if (cur->type == XML_NAMESPACE_DECL)
			{
			    XP_TEST_HIT_NS
                        }
                    } else {
                        if (cur->type == XML_ELEMENT_NODE) {
                            if (prefix == NULL)
			    {
				XP_TEST_HIT

                            } else if ((cur->ns != NULL) &&
				(xmlStrEqual(URI, cur->ns->href)))
			    {
				XP_TEST_HIT
                            }
                        }
                    }
                    break;
                case NODE_TEST_NS:{
                        /* TODO */
                        break;
                    }
                case NODE_TEST_NAME:
                    if (axis == AXIS_ATTRIBUTE) {
                        if (cur->type != XML_ATTRIBUTE_NODE)
			    break;
		    } else if (axis == AXIS_NAMESPACE) {
                        if (cur->type != XML_NAMESPACE_DECL)
			    break;
		    } else {
		        if (cur->type != XML_ELEMENT_NODE)
			    break;
		    }
                    switch (cur->type) {
                        case XML_ELEMENT_NODE:
                            if (xmlStrEqual(name, cur->name)) {
                                if (prefix == NULL) {
                                    if (cur->ns == NULL)
				    {
					XP_TEST_HIT
                                    }
                                } else {
                                    if ((cur->ns != NULL) &&
                                        (xmlStrEqual(URI, cur->ns->href)))
				    {
					XP_TEST_HIT
                                    }
                                }
                            }
                            break;
                        case XML_ATTRIBUTE_NODE:{
                                xmlAttrPtr attr = (xmlAttrPtr) cur;

                                if (xmlStrEqual(name, attr->name)) {
                                    if (prefix == NULL) {
                                        if ((attr->ns == NULL) ||
                                            (attr->ns->prefix == NULL))
					{
					    XP_TEST_HIT
                                        }
                                    } else {
                                        if ((attr->ns != NULL) &&
                                            (xmlStrEqual(URI,
					      attr->ns->href)))
					{
					    XP_TEST_HIT
                                        }
                                    }
                                }
                                break;
                            }
                        case XML_NAMESPACE_DECL:
                            if (cur->type == XML_NAMESPACE_DECL) {
                                xmlNsPtr ns = (xmlNsPtr) cur;

                                if ((ns->prefix != NULL) && (name != NULL)
                                    && (xmlStrEqual(ns->prefix, name)))
				{
				    XP_TEST_HIT_NS
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
	    } /* switch(test) */
        } while ((cur != NULL) && (ctxt->error == XPATH_EXPRESSION_OK));

	goto apply_predicates;

axis_range_end: /* ----------------------------------------------------- */
	/*
	* We have a "/foo[n]", and position() = n was reached.
	* Note that we can have as well "/foo/::parent::foo[1]", so
	* a duplicate-aware merge is still needed.
	* Merge with the result.
	*/
	if (outSeq == NULL) {
	    outSeq = seq;
	    seq = NULL;
	} else {
	    outSeq = mergeAndClear(outSeq, seq);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
	/*
	* Break if only a true/false result was requested.
	*/
	if (toBool)
	    break;
	continue;

first_hit: /* ---------------------------------------------------------- */
	/*
	* Break if only a true/false result was requested and
	* no predicates existed and a node test succeeded.
	*/
	if (outSeq == NULL) {
	    outSeq = seq;
	    seq = NULL;
	} else {
	    outSeq = mergeAndClear(outSeq, seq);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
	break;

apply_predicates: /* --------------------------------------------------- */
        if (ctxt->error != XPATH_EXPRESSION_OK)
	    goto error;

        /*
	* Apply predicates.
	*/
        if ((predOp != NULL) && (seq->nodeNr > 0)) {
	    /*
	    * E.g. when we have a "/foo[some expression][n]".
	    */
	    /*
	    * QUESTION TODO: The old predicate evaluation took into
	    *  account location-sets.
	    *  (E.g. ctxt->value->type == XPATH_LOCATIONSET)
	    *  Do we expect such a set here?
	    *  All what I learned now from the evaluation semantics
	    *  does not indicate that a location-set will be processed
	    *  here, so this looks OK.
	    */
	    /*
	    * Iterate over all predicates, starting with the outermost
	    * predicate.
	    * TODO: Problem: we cannot execute the inner predicates first
	    *  since we cannot go back *up* the operator tree!
	    *  Options we have:
	    *  1) Use of recursive functions (like is it currently done
	    *     via xmlXPathCompOpEval())
	    *  2) Add a predicate evaluation information stack to the
	    *     context struct
	    *  3) Change the way the operators are linked; we need a
	    *     "parent" field on xmlXPathStepOp
	    *
	    * For the moment, I'll try to solve this with a recursive
	    * function: xmlXPathCompOpEvalPredicate().
	    */
	    if (hasPredicateRange != 0)
		xmlXPathCompOpEvalPredicate(ctxt, predOp, seq, maxPos, maxPos,
					    hasNsNodes);
	    else
		xmlXPathCompOpEvalPredicate(ctxt, predOp, seq, 1, seq->nodeNr,
					    hasNsNodes);

	    if (ctxt->error != XPATH_EXPRESSION_OK) {
		total = 0;
		goto error;
	    }
        }

        if (seq->nodeNr > 0) {
	    /*
	    * Add to result set.
	    */
	    if (outSeq == NULL) {
		outSeq = seq;
		seq = NULL;
	    } else {
		outSeq = mergeAndClear(outSeq, seq);
                if (outSeq == NULL)
                    xmlXPathPErrMemory(ctxt);
	    }

            if (toBool)
                break;
	}
    }

error:
    if ((obj->boolval) && (obj->user != NULL)) {
	/*
	* QUESTION TODO: What does this do and why?
	* TODO: Do we have to do this also for the "error"
	* cleanup further down?
	*/
	ctxt->value->boolval = 1;
	ctxt->value->user = obj->user;
	obj->user = NULL;
	obj->boolval = 0;
    }
    xmlXPathReleaseObject(xpctxt, obj);

    /*
    * Ensure we return at least an empty set.
    */
    if (outSeq == NULL) {
	if ((seq != NULL) && (seq->nodeNr == 0)) {
	    outSeq = seq;
        } else {
	    outSeq = xmlXPathNodeSetCreate(NULL);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
    }
    if ((seq != NULL) && (seq != outSeq)) {
	 xmlXPathFreeNodeSet(seq);
    }
    /*
    * Hand over the result. Better to push the set also in
    * case of errors.
    */
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, outSeq));
    /*
    * Reset the context node.
    */
    xpctxt->node = oldContextNode;
    /*
    * When traversing the namespace axis in "toBool" mode, it's
    * possible that tmpNsList wasn't freed.
    */
    if (xpctxt->tmpNsList != NULL) {
        xmlFree(xpctxt->tmpNsList);
        xpctxt->tmpNsList = NULL;
    }

    return(total);
}